

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

uint32_t generateBucketId(string *typeName)

{
  long lVar1;
  string local_38 [32];
  uint32_t local_18;
  byte local_11;
  uint32_t postfix;
  bool file_exist;
  string *typeName_local;
  
  _postfix = typeName;
  do {
    lVar1 = random();
    local_18 = (uint32_t)lVar1;
    generateBucketFileName(local_38,(uint32_t)_postfix);
    local_11 = checkFileExist(local_38);
    std::__cxx11::string::~string((string *)local_38);
  } while ((local_11 & 1) != 0);
  return local_18;
}

Assistant:

uint32_t generateBucketId(string &typeName) {

    bool file_exist;

    uint32_t postfix;

    do {
        postfix = random();

        file_exist = checkFileExist(generateBucketFileName(typeName, postfix));

    } while(file_exist);

    return postfix;
}